

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O2

void __thiscall
solitaire::graphics::Renderer::Renderer
          (Renderer *this,Context *context,
          unique_ptr<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
          *graphicsSystem,string *assetsPath)

{
  GraphicsSystem *pGVar1;
  allocator<char> local_4d;
  undefined1 local_4c [40];
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  
  (this->super_Renderer)._vptr_Renderer = (_func_int **)&PTR__Renderer_00117830;
  this->context = context;
  (this->graphicsSystem)._M_t.
  super___uniq_ptr_impl<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
  .super__Head_base<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_false>._M_head_impl =
       (graphicsSystem->_M_t).
       super___uniq_ptr_impl<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
       ._M_t.
       super__Tuple_impl<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
       .super__Head_base<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_false>._M_head_impl
  ;
  (graphicsSystem->_M_t).
  super___uniq_ptr_impl<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
  .super__Head_base<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_false>._M_head_impl =
       (GraphicsSystem *)0x0;
  std::__cxx11::string::string((string *)&this->assetsPath,(string *)assetsPath);
  this->newGameId = 0;
  this->undoId = 0;
  this->backgroundId = 0;
  this->cardsId = 0;
  this->cardPlaceholderId = 0;
  this->winId = 0;
  pGVar1 = (this->graphicsSystem)._M_t.
           super___uniq_ptr_impl<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           ._M_t.
           super__Tuple_impl<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           .super__Head_base<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_false>.
           _M_head_impl;
  (*pGVar1->_vptr_GraphicsSystem[2])
            (pGVar1,(anonymous_namespace)::windowTitle_abi_cxx11_,0x280,0x1e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_4c + 4),"background.bmp",&local_4d);
  loadTexture((Renderer *)local_4c,(string *)this);
  (this->backgroundId).t = local_4c._0_4_;
  std::__cxx11::string::~string((string *)(local_4c + 4));
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_4c + 4),"cards.bmp",&local_4d)
  ;
  loadTexture((Renderer *)local_4c,(string *)this);
  (this->cardsId).t = local_4c._0_4_;
  std::__cxx11::string::~string((string *)(local_4c + 4));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_4c + 4),"card_placeholder.bmp",&local_4d);
  loadTexture((Renderer *)local_4c,(string *)this);
  (this->cardPlaceholderId).t = local_4c._0_4_;
  std::__cxx11::string::~string((string *)(local_4c + 4));
  pGVar1 = (this->graphicsSystem)._M_t.
           super___uniq_ptr_impl<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           ._M_t.
           super__Tuple_impl<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           .super__Head_base<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_false>.
           _M_head_impl;
  local_1c = (this->cardPlaceholderId).t;
  (*pGVar1->_vptr_GraphicsSystem[4])(pGVar1,&local_1c,0x46);
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_4c + 4),"win.bmp",&local_4d);
  loadTexture((Renderer *)local_4c,(string *)this);
  (this->winId).t = local_4c._0_4_;
  std::__cxx11::string::~string((string *)(local_4c + 4));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_4c + 4),"new_game.bmp",&local_4d);
  loadTexture((Renderer *)local_4c,(string *)this);
  (this->newGameId).t = local_4c._0_4_;
  std::__cxx11::string::~string((string *)(local_4c + 4));
  pGVar1 = (this->graphicsSystem)._M_t.
           super___uniq_ptr_impl<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           ._M_t.
           super__Tuple_impl<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           .super__Head_base<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_false>.
           _M_head_impl;
  local_20 = (this->newGameId).t;
  (*pGVar1->_vptr_GraphicsSystem[4])(pGVar1,&local_20,0x96);
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_4c + 4),"undo.bmp",&local_4d);
  loadTexture((Renderer *)local_4c,(string *)this);
  (this->undoId).t = local_4c._0_4_;
  std::__cxx11::string::~string((string *)(local_4c + 4));
  pGVar1 = (this->graphicsSystem)._M_t.
           super___uniq_ptr_impl<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           ._M_t.
           super__Tuple_impl<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           .super__Head_base<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_false>.
           _M_head_impl;
  local_24 = (this->undoId).t;
  (*pGVar1->_vptr_GraphicsSystem[4])(pGVar1,&local_24,0x96);
  return;
}

Assistant:

Renderer::Renderer(const Context& context,
                   std::unique_ptr<GraphicsSystem> graphicsSystem,
                   const std::string& assetsPath):
    context {context},
    graphicsSystem {std::move(graphicsSystem)},
    assetsPath {assetsPath}
{
    this->graphicsSystem->createWindow(windowTitle, windowWidth, windowHeight);
    backgroundId = loadTexture("background.bmp");
    cardsId = loadTexture("cards.bmp");
    cardPlaceholderId = loadTexture("card_placeholder.bmp");
    this->graphicsSystem->setTextureAlpha(cardPlaceholderId, cardPlaceholderAlpha);
    winId = loadTexture("win.bmp");
    newGameId = loadTexture("new_game.bmp");
    this->graphicsSystem->setTextureAlpha(newGameId, buttonAlpha);
    undoId = loadTexture("undo.bmp");
    this->graphicsSystem->setTextureAlpha(undoId, buttonAlpha);
}